

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptl.cpp
# Opt level: O3

bool __thiscall
pg::PTLSolver::attractTangle(PTLSolver *this,int t,int pl,bitset *R,bitset *Z,bitset *G)

{
  uint uVar1;
  int iVar2;
  pointer piVar3;
  uint *puVar4;
  ostream *poVar5;
  ulong uVar6;
  bool bVar7;
  uint *puVar8;
  ulong uVar9;
  uint uVar10;
  _label_vertex local_40;
  
  piVar3 = (this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  uVar10 = piVar3[t];
  if ((uVar10 != 0xffffffff) && ((pl == -1 || ((uVar10 & 1) == pl)))) {
    puVar4 = (uint *)(this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                     super__Vector_impl_data._M_start[t];
    uVar10 = *puVar4;
    if (uVar10 != 0xffffffff) {
      bVar7 = false;
      puVar8 = puVar4;
      uVar1 = uVar10;
      do {
        while( true ) {
          puVar8 = puVar8 + 2;
          uVar6 = (ulong)(long)(int)uVar1 >> 6;
          if (((this->G)._bits[uVar6] >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
            piVar3[t] = -1;
            return false;
          }
          uVar9 = 1L << ((ulong)uVar1 & 0x3f);
          if ((Z->_bits[uVar6] & uVar9) == 0) break;
          uVar1 = *puVar8;
          if (*puVar8 == 0xffffffff) {
            if (!bVar7) {
              return false;
            }
            goto LAB_0017095f;
          }
        }
        if ((R->_bits[uVar6] & uVar9) == 0) {
          return false;
        }
        uVar1 = *puVar8;
        bVar7 = true;
      } while (uVar1 != 0xffffffff);
LAB_0017095f:
      puVar8 = (uint *)(this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                       super__Vector_impl_data._M_start[t];
      uVar1 = *puVar8;
      if (uVar1 != 0xffffffff) {
        do {
          puVar8 = puVar8 + 1;
          if (((Z->_bits[(ulong)(long)(int)uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) == 0) &&
             ((G->_bits[(ulong)(long)(int)uVar1 >> 6] & 1L << ((ulong)uVar1 & 0x3f)) != 0)) {
            return false;
          }
          uVar1 = *puVar8;
        } while (uVar1 != 0xffffffff);
      }
      do {
        uVar9 = (ulong)(int)uVar10;
        uVar6 = Z->_bits[uVar9 >> 6];
        if ((uVar6 >> (uVar9 & 0x3f) & 1) == 0) {
          uVar1 = puVar4[1];
          Z->_bits[uVar9 >> 6] = uVar6 | 1L << (uVar9 & 0x3f);
          this->str[uVar9] = uVar1;
          iVar2 = (this->Q).pointer;
          (this->Q).pointer = iVar2 + 1;
          (this->Q).queue[iVar2] = uVar10;
          if (2 < (this->super_Solver).trace) {
            poVar5 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"\x1b[1;37mattracted \x1b[36m",0x16);
            local_40.g = (this->super_Solver).game;
            local_40.v = uVar10;
            poVar5 = operator<<(poVar5,&local_40);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[m by \x1b[1;36m",0xe);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,pl);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[m",3);
            poVar5 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," (via tangle ",0xd);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,t);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
            std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
          }
        }
        uVar10 = puVar4[2];
        puVar4 = puVar4 + 2;
      } while (uVar10 != 0xffffffff);
      return true;
    }
  }
  return false;
}

Assistant:

bool
PTLSolver::attractTangle(const int t, const int pl, bitset &R, bitset &Z, bitset &G)
{
    /**
     * Check if tangle is won by player <pl> and not deleted.
     */
    {
        const int tangle_pr = tpr[t];
        if (tangle_pr == -1) return false; // deleted tangle
        if (pl != -1 and pl != (tangle_pr&1)) return false; // not of desired parity
    }

    /**
     * Check if tangle is contained in Z+R and if any vertices are not already in Z
     * If no new vertices could be attracted, then don't attract...
     */
    {
        bool can_attract_new = false;
        int *ptr = tv[t];
        for (;;) {
            const int v = *ptr++;
            if (v == -1) break;
            ptr++; // skip strategy
            if (!this->G[v]) {
                // on-the-fly detect out-of-game tangles
                tpr[t] = -1; // delete the tangle
                return false; // is now a deleted tangle
            } else if (Z[v]) {
                continue; // already attracted
            } else if (R[v]) {
                can_attract_new = true; // has vertices not yet attracted
            } else {
                return false; // not contained in Z+R
            }
        }
        if (!can_attract_new) return false;
    }

    /**
     * Check if the tangle can escape to G\Z.
     */
    {
        int v, *ptr = tout[t];
        while ((v=*ptr++) != -1) {
            if (Z[v]) continue;
            if (G[v]) return false; // opponent escapes
        }
    }

    /**
     * Attract!
     */
    {
        int *ptr = tv[t];
        for (;;) {
            const int v = *ptr++;
            if (v == -1) break;
            const int s = *ptr++;
            if (Z[v]) continue; // already in <Z>
            Z[v] = true;
            str[v] = s;
            Q.push(v);

#ifndef NDEBUG
            // maybe report event
            if (trace >= 3) {
                logger << "\033[1;37mattracted \033[36m" << label_vertex(v) << "\033[m by \033[1;36m" << pl << "\033[m";
                logger << " (via tangle " << t << ")" << std::endl;
            }
#endif
        }
    }

    return true;
}